

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# creadhb.c
# Opt level: O3

int cParseIntFormat(char *buf,int *num,int *size)

{
  byte bVar1;
  int iVar2;
  byte *pbVar3;
  
  do {
    bVar1 = *buf;
    buf = (char *)((byte *)buf + 1);
  } while (bVar1 != 0x28);
  __isoc99_sscanf(buf,"%d",num);
  do {
    pbVar3 = (byte *)buf + 1;
    bVar1 = *buf;
    buf = (char *)pbVar3;
  } while ((bVar1 | 0x20) != 0x69);
  iVar2 = __isoc99_sscanf(pbVar3,"%d",size);
  return iVar2;
}

Assistant:

int cParseIntFormat(char *buf, int *num, int *size)
{
    char *tmp;

    tmp = buf;
    while (*tmp++ != '(') ;
    sscanf(tmp, "%d", num);
    while (*tmp != 'I' && *tmp != 'i') ++tmp;
    ++tmp;
    sscanf(tmp, "%d", size);
    return 0;
}